

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

set * __thiscall QPDFJob::getWantedJSONObjects(set *__return_storage_ptr__,QPDFJob *this)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  _Base_ptr p_Var3;
  QPDFObjGen og;
  bool trailer;
  int gen;
  int obj;
  bool local_39;
  int local_38;
  int local_34;
  
  p_Var1 = &(__return_storage_ptr__->
            super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>)._M_t._M_impl.
            super__Rb_tree_header;
  (__return_storage_ptr__->super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__return_storage_ptr__->super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  )._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (__return_storage_ptr__->super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  )._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  peVar2 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  for (p_Var3 = *(_Base_ptr *)
                 ((long)&(peVar2->json_objects)._M_t._M_impl.super__Rb_tree_header + 0x10);
      p_Var3 != &(peVar2->json_objects)._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    local_34 = 0;
    local_38 = 0;
    parse_object_id((string *)(p_Var3 + 1),&local_39,&local_34,&local_38);
    og.gen = local_38;
    og.obj = local_34;
    QPDFObjGen::set::add(__return_storage_ptr__,og);
  }
  return __return_storage_ptr__;
}

Assistant:

QPDFObjGen::set
QPDFJob::getWantedJSONObjects()
{
    QPDFObjGen::set wanted_og;
    for (auto const& iter: m->json_objects) {
        bool trailer;
        int obj = 0;
        int gen = 0;
        parse_object_id(iter, trailer, obj, gen);
        wanted_og.add(QPDFObjGen(obj, gen));
    }
    return wanted_og;
}